

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_leader.cpp
# Opt level: O0

bool __thiscall
ON_Leader::LandingLine3d(ON_Leader *this,ON_DimStyle *dimstyle,double dimscale,ON_Line *line)

{
  bool bVar1;
  ON_3dPoint local_a0;
  ON_3dPoint local_88;
  undefined4 local_70;
  undefined1 local_60 [8];
  ON_Line line2d;
  ON_Line *line_local;
  double dimscale_local;
  ON_DimStyle *dimstyle_local;
  ON_Leader *this_local;
  
  line2d.to.z = (double)line;
  ON_Line::ON_Line((ON_Line *)local_60);
  bVar1 = LandingLine2d(this,dimstyle,dimscale,(ON_Line *)local_60);
  if (bVar1) {
    ON_Plane::PointAt(&local_88,&(this->super_ON_Annotation).m_plane,(double)local_60,line2d.from.x)
    ;
    *(double *)((long)line2d.to.z + 0x10) = local_88.z;
    *(double *)line2d.to.z = local_88.x;
    *(double *)((long)line2d.to.z + 8) = local_88.y;
    ON_Plane::PointAt(&local_a0,&(this->super_ON_Annotation).m_plane,line2d.from.z,line2d.to.x);
    *(double *)((long)line2d.to.z + 0x18) = local_a0.x;
    *(double *)((long)line2d.to.z + 0x20) = local_a0.y;
    *(double *)((long)line2d.to.z + 0x28) = local_a0.z;
  }
  local_70 = 1;
  ON_Line::~ON_Line((ON_Line *)local_60);
  return bVar1;
}

Assistant:

bool ON_Leader::LandingLine3d(
  const ON_DimStyle* dimstyle,
  double dimscale,
  ON_Line& line) const
{
  ON_Line line2d;
  if (!LandingLine2d(dimstyle, dimscale, line2d))
    return false;
  line.from = m_plane.PointAt(line2d.from.x, line2d.from.y);
  line.to = m_plane.PointAt(line2d.to.x, line2d.to.y);
  return true;
}